

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int is_all_ascii(char *p)

{
  byte bVar1;
  byte *local_20;
  uchar *pp;
  char *p_local;
  
  local_20 = (byte *)p;
  do {
    if (*local_20 == 0) {
      return 1;
    }
    bVar1 = *local_20;
    local_20 = local_20 + 1;
  } while (bVar1 < 0x80);
  return 0;
}

Assistant:

static int
is_all_ascii(const char *p)
{
	const unsigned char *pp = (const unsigned char *)p;

	while (*pp) {
		if (*pp++ > 127)
			return (0);
	}
	return (1);
}